

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **argv_00;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int *piVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  unsigned_long ul;
  
  progname = *argv;
  uVar1 = str_len(progname);
  lVar6 = (long)(int)uVar1;
  do {
    lVar4 = lVar6;
    if (lVar4 == 0) goto LAB_001039c5;
    lVar6 = lVar4 + -1;
  } while (progname[lVar4 + -1] != '/');
  progname = progname + lVar4;
LAB_001039c5:
  if (*progname == 'd') {
    progname = progname + 1;
  }
  pcVar5 = progname;
  iVar2 = str_diff(progname,"setuidgid");
  if (iVar2 == 0) {
    setuidgid((int)pcVar5,argv);
  }
  pcVar5 = progname;
  iVar2 = str_diff(progname,"envuidgid");
  if (iVar2 == 0) {
    envuidgid((int)pcVar5,argv);
  }
  pcVar5 = progname;
  iVar2 = str_diff(progname,"envdir");
  if (iVar2 == 0) {
    envdir((int)pcVar5,argv);
  }
  pcVar5 = progname;
  iVar2 = str_diff(progname,"pgrphack");
  if (iVar2 == 0) {
    pgrphack((int)pcVar5,argv);
  }
  iVar2 = str_diff(progname,"setlock");
  if (iVar2 == 0) {
    setlock(argc,argv);
    pcVar5 = argv[1];
    if (pcVar5 == (char *)0x0) {
      setuidgid_usage();
    }
    if (argv[2] == (char *)0x0) {
      setuidgid_usage();
    }
    suidgid(pcVar5,0);
    pathexec(argv + 2);
    fatal2("unable to run",argv[2]);
    return extraout_EAX;
  }
  iVar2 = str_diff(progname,"softlimit");
  if (iVar2 == 0) {
    softlimit(argc,argv);
  }
switchD_00103abf_caseD_4d:
  iVar2 = sgetoptmine(argc,argv,"u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V");
  pcVar5 = subgetoptarg;
  if (iVar2 == subgetoptdone) {
    lVar6 = (long)subgetoptind;
    if (argv[lVar6] == (char *)0x0) {
      usage();
    }
    if (pgrp != 0) {
      setsid();
    }
    if (env_dir != (char *)0x0) {
      edir(env_dir);
    }
    if (root != (char *)0x0) {
      iVar2 = chdir(root);
      if (iVar2 == -1) {
        fatal2("unable to change directory",root);
      }
      iVar2 = chroot(".");
      if (iVar2 == -1) {
        fatal("unable to change root directory");
      }
    }
    lVar4 = nicelvl;
    if (nicelvl != 0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      iVar2 = nice((int)lVar4);
      if ((iVar2 == -1) && (*piVar3 != 0)) {
        fatal("unable to set nice level");
      }
    }
    if (env_user != (char *)0x0) {
      euidgid(env_user,1);
    }
    if (set_user != (char *)0x0) {
      suidgid(set_user,1);
    }
    if (lock != (char *)0x0) {
      slock(lock,lockdelay,0);
    }
    if ((nostdin != 0) && (iVar2 = close(0), iVar2 == -1)) {
      fatal("unable to close stdin");
    }
    if ((nostdout != 0) && (iVar2 = close(1), iVar2 == -1)) {
      fatal("unable to close stdout");
    }
    argv_00 = argv + lVar6;
    if ((nostderr != 0) && (iVar2 = close(2), iVar2 == -1)) {
      fatal("unable to close stderr");
    }
    slimit();
    progname = *argv_00;
    if (argv0 != (char *)0x0) {
      *argv_00 = argv0;
    }
    pathexec_env_run(progname,argv_00);
    fatal2("unable to run",*argv_00);
    return 0;
  }
  switch(iVar2) {
  case 0x4c:
    if (lock != (char *)0x0) {
      usage();
    }
    lock = subgetoptarg;
    lockdelay = 0;
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x71:
  case 0x73:
    goto switchD_00103abf_caseD_4d;
  case 0x50:
    pgrp = 1;
    goto switchD_00103abf_caseD_4d;
  case 0x55:
    env_user = subgetoptarg;
    goto switchD_00103abf_caseD_4d;
  case 0x56:
    strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0);
    break;
  case 0x62:
    argv0 = subgetoptarg;
    goto switchD_00103abf_caseD_4d;
  case 99:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitc = ul;
    goto switchD_00103abf_caseD_4d;
  case 100:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitd = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x65:
    env_dir = subgetoptarg;
    goto switchD_00103abf_caseD_4d;
  case 0x66:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitf = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x6c:
    if (lock != (char *)0x0) {
      usage();
    }
    lock = subgetoptarg;
    lockdelay = 1;
    goto switchD_00103abf_caseD_4d;
  case 0x6d:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitd = ul;
    limits = limitd;
    limitl = limitd;
    limita = limitd;
    goto switchD_00103abf_caseD_4d;
  case 0x6e:
    if (*subgetoptarg == '+') {
      subgetoptarg = subgetoptarg + 1;
    }
    else if (*subgetoptarg == '-') {
      subgetoptarg = subgetoptarg + 1;
      uVar1 = scan_ulong(subgetoptarg,&ul);
      if (pcVar5[(ulong)uVar1 + 1] != '\0') {
        usage();
      }
      nicelvl = -ul;
      goto switchD_00103abf_caseD_4d;
    }
    pcVar5 = subgetoptarg;
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    nicelvl = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x6f:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limito = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x70:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitp = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x72:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitr = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x74:
    uVar1 = scan_ulong(subgetoptarg,&ul);
    if (pcVar5[uVar1] != '\0') {
      usage();
    }
    limitt = ul;
    goto switchD_00103abf_caseD_4d;
  case 0x75:
    set_user = subgetoptarg;
    goto switchD_00103abf_caseD_4d;
  case 0x76:
    verbose = 1;
    goto switchD_00103abf_caseD_4d;
  default:
    switch(iVar2) {
    case 0x2f:
      root = subgetoptarg;
      goto switchD_00103abf_caseD_4d;
    case 0x30:
      nostdin = 1;
      goto switchD_00103abf_caseD_4d;
    case 0x31:
      nostdout = 1;
      goto switchD_00103abf_caseD_4d;
    case 0x32:
      nostderr = 1;
      goto switchD_00103abf_caseD_4d;
    }
    if (iVar2 != 0x3f) goto switchD_00103abf_caseD_4d;
  }
  usage();
  goto switchD_00103abf_caseD_4d;
}

Assistant:

int main(int argc, const char **argv) {
  int opt;
  int i;
  unsigned long ul;

  progname =argv[0];
  for (i =str_len(progname); i; --i)
    if (progname[i -1] == '/') {
      progname +=i;
      break;
    }
  if (progname[0] == 'd') ++progname;

  /* argv[0] */
  if (str_equal(progname, "setuidgid")) setuidgid(argc, argv);
  if (str_equal(progname, "envuidgid")) envuidgid(argc, argv);
  if (str_equal(progname, "envdir")) envdir(argc, argv);
  if (str_equal(progname, "pgrphack")) pgrphack(argc, argv);
  if (str_equal(progname, "setlock")) setlock(argc, argv);
  if (str_equal(progname, "softlimit")) softlimit(argc, argv);

  while ((opt =getopt(argc, argv, "u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V"))
         != opteof)
    switch(opt) {
    case 'u': set_user =(char*)optarg; break;
    case 'U': env_user =(char*)optarg; break;
    case 'b': argv0 =(char*)optarg; break;
    case 'e': env_dir =optarg; break;
    case 'm':
      if (optarg[scan_ulong(optarg, &ul)]) usage();
      limits =limitl =limita =limitd =ul;
      break;
    case 'd': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitd =ul; break;
    case 'o': if (optarg[scan_ulong(optarg, &ul)]) usage(); limito =ul; break;
    case 'p': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitp =ul; break;
    case 'f': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitf =ul; break;
    case 'c': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitc =ul; break;
    case 'r': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitr =ul; break;
    case 't': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitt =ul; break;
    case '/': root =optarg; break;
    case 'n':
      switch (*optarg) {
        case '-':
          ++optarg; /* about ordering safety.... */
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          nicelvl *=-1;
          break;
        case '+': ++optarg;
        default:
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          break;
      }
      break;
    case 'l': if (lock) usage(); lock =optarg; lockdelay =1; break;
    case 'L': if (lock) usage(); lock =optarg; lockdelay =0; break;
    case 'v': verbose =1; break;
    case 'P': pgrp =1; break;
    case '0': nostdin =1; break;
    case '1': nostdout =1; break;
    case '2': nostderr =1; break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if (pgrp) setsid();
  if (env_dir) edir(env_dir);
  if (root) {
    if (chdir(root) == -1) fatal2("unable to change directory", root);
    if (chroot(".") == -1) fatal("unable to change root directory");
  }
  if (nicelvl) {
    errno =0;
    if (nice(nicelvl) == -1) if (errno) fatal("unable to set nice level");
  }
  if (env_user) euidgid(env_user, 1);
  if (set_user) suidgid(set_user, 1);
  if (lock) slock(lock, lockdelay, 0);
  if (nostdin) if (close(0) == -1) fatal("unable to close stdin");
  if (nostdout) if (close(1) == -1) fatal("unable to close stdout");
  if (nostderr) if (close(2) == -1) fatal("unable to close stderr");
  slimit();

  progname =*argv;
  if (argv0) *argv =argv0;
  pathexec_env_run(progname, argv);
  fatal2("unable to run", *argv);
  return(0);
}